

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_3::DBIter::FindNextUserEntry(DBIter *this,bool skipping,string *skip)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  ParsedInternalKey ikey;
  pointer local_68;
  size_type local_60;
  ParsedInternalKey local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    __assert_fail("iter_->Valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0xb3,
                  "void leveldb::(anonymous namespace)::DBIter::FindNextUserEntry(bool, std::string *)"
                 );
  }
  if (this->direction_ != kForward) {
    __assert_fail("direction_ == kForward",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0xb4,
                  "void leveldb::(anonymous namespace)::DBIter::FindNextUserEntry(bool, std::string *)"
                 );
  }
  do {
    local_58.user_key.data_ = "";
    local_58.user_key.size_ = 0;
    bVar1 = ParseKey(this,&local_58);
    if ((bVar1) && (local_58.sequence <= this->sequence_)) {
      if (local_58.type == kTypeValue) {
        if ((skipping & 1U) != 0) {
          local_68 = (skip->_M_dataplus)._M_p;
          local_60 = skip->_M_string_length;
          iVar2 = (*this->user_comparator_->_vptr_Comparator[2])
                            (this->user_comparator_,&local_58,&local_68);
          skipping = true;
          if (iVar2 < 1) goto LAB_00547a10;
        }
        this->valid_ = true;
        (this->saved_key_)._M_string_length = 0;
        *(this->saved_key_)._M_dataplus._M_p = '\0';
        goto LAB_00547a3f;
      }
      if (local_58.type == kTypeDeletion) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (skip,local_58.user_key.data_,local_58.user_key.size_);
        skipping = true;
      }
    }
LAB_00547a10:
    (*this->iter_->_vptr_Iterator[6])();
    iVar2 = (*this->iter_->_vptr_Iterator[2])();
  } while ((char)iVar2 != '\0');
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  this->valid_ = false;
LAB_00547a3f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::FindNextUserEntry(bool skipping, std::string* skip) {
  // Loop until we hit an acceptable entry to yield
  assert(iter_->Valid());
  assert(direction_ == kForward);
  do {
    ParsedInternalKey ikey;
    if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
      switch (ikey.type) {
        case kTypeDeletion:
          // Arrange to skip all upcoming entries for this key since
          // they are hidden by this deletion.
          SaveKey(ikey.user_key, skip);
          skipping = true;
          break;
        case kTypeValue:
          if (skipping &&
              user_comparator_->Compare(ikey.user_key, *skip) <= 0) {
            // Entry hidden
          } else {
            valid_ = true;
            saved_key_.clear();
            return;
          }
          break;
      }
    }
    iter_->Next();
  } while (iter_->Valid());
  saved_key_.clear();
  valid_ = false;
}